

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall TileWire::setDirection(TileWire *this,Direction direction,bool noAdjacentUpdates)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Type TVar3;
  Board *pBVar4;
  
  TVar3 = this->_type;
  if (TVar3 == CROSSOVER) {
    if ((direction & 0x80000001) != EAST) {
      return;
    }
    uVar1 = this->_state1;
    uVar2 = this->_state2;
    this->_state1 = uVar2;
    this->_state2 = uVar1;
  }
  else {
    if (TVar3 == JUNCTION) {
      return;
    }
    if (TVar3 == STRAIGHT) {
      direction = (int)direction % 2;
    }
    (this->super_Tile)._direction = direction;
  }
  (*(this->super_Tile)._vptr_Tile[8])(this,0,noAdjacentUpdates);
  pBVar4 = Tile::getBoardPtr(&this->super_Tile);
  pBVar4->changesMade = true;
  return;
}

Assistant:

void TileWire::setDirection(Direction direction, bool noAdjacentUpdates) {
    if (_type != JUNCTION) {
        if (_type != CROSSOVER) {
            if (_type == STRAIGHT) {
                _direction = static_cast<Direction>(direction % 2);
            } else {
                _direction = direction;
            }
            addUpdate(false, noAdjacentUpdates);
            getBoardPtr()->changesMade = true;
        } else if (direction % 2 == 1) {    // If direction odd, assume 1 or 3 rotations were made to the crossover wire.
            State tempState = _state1;
            _state1 = _state2;
            _state2 = tempState;
            addUpdate(false, noAdjacentUpdates);
            getBoardPtr()->changesMade = true;
        }
    }
}